

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O3

ssize_t __thiscall DomBrush::read(DomBrush *this,int __fd,void *__buf,size_t __nbytes)

{
  char cVar1;
  int iVar2;
  DomColor *this_00;
  DomProperty *this_01;
  DomGradient *this_02;
  char16_t *pcVar3;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  undefined4 in_register_00000034;
  long lVar4;
  long in_FS_OFFSET;
  QStringView QVar5;
  QStringView QVar6;
  QStringView QVar7;
  QStringView QVar8;
  QStringView QVar9;
  QStringBuilder<QLatin1String,_const_QStringView_&> local_98;
  QString local_80;
  QStringView local_68;
  QArrayDataPointer<QXmlStreamAttribute> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QXmlStreamReader::attributes();
  if (local_50.size != 0) {
    lVar4 = 0;
    do {
      local_68.m_data = *(storage_type_conflict **)(local_50.ptr + lVar4 + 8);
      local_68.m_size = *(qsizetype *)(local_50.ptr + lVar4 + 0x10);
      if ((local_68.m_size == 10) &&
         (QVar9.m_data = local_68.m_data, QVar9.m_size = 10, QVar5.m_data = L"brushstyle",
         QVar5.m_size = 10, cVar1 = QtPrivate::equalStrings(QVar9,QVar5), cVar1 != '\0')) {
        QString::QString(&local_80,*(QChar **)(local_50.ptr + lVar4 + 0x50),
                         *(longlong *)(local_50.ptr + lVar4 + 0x58));
        QString::operator=(&this->m_attr_brushStyle,&local_80);
        this->m_has_attr_brushStyle = true;
        if (&(local_80.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_80.d.d)->super_QArrayData,2,0x10);
          }
        }
      }
      else {
        local_98.a.m_size = 0x15;
        local_98.a.m_data = "Unexpected attribute ";
        local_98.b = &local_68;
        QStringBuilder<QLatin1String,_const_QStringView_&>::convertTo<QString>(&local_80,&local_98);
        QXmlStreamReader::raiseError((QString *)CONCAT44(in_register_00000034,__fd));
        if (&(local_80.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_80.d.d)->super_QArrayData,2,0x10);
          }
        }
      }
      lVar4 = lVar4 + 0x68;
    } while (local_50.size * 0x68 != lVar4);
  }
  iVar2 = QXmlStreamReader::error();
  while (iVar2 == 0) {
    iVar2 = QXmlStreamReader::readNext();
    if (iVar2 == 4) {
      local_68.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_68.m_data = (storage_type_conflict *)&DAT_aaaaaaaaaaaaaaaa;
      QVar9 = (QStringView)QXmlStreamReader::name();
      QVar6.m_data = L"color";
      QVar6.m_size = 5;
      pcVar3 = L"color";
      local_68 = QVar9;
      iVar2 = QtPrivate::compareStrings(QVar9,QVar6,CaseInsensitive);
      if (iVar2 == 0) {
        this_00 = (DomColor *)operator_new(0x18);
        this_00->m_attr_alpha = 0;
        this_00->m_has_attr_alpha = false;
        *(undefined3 *)&this_00->field_0x5 = 0;
        this_00->m_children = 0;
        this_00->m_red = 0;
        this_00->m_green = 0;
        this_00->m_blue = 0;
        DomColor::read(this_00,__fd,__buf_00,(size_t)pcVar3);
        clear(this);
        this->m_kind = Color;
        this->m_color = this_00;
      }
      else {
        QVar7.m_data = L"texture";
        QVar7.m_size = 7;
        pcVar3 = L"texture";
        iVar2 = QtPrivate::compareStrings(QVar9,QVar7,CaseInsensitive);
        if (iVar2 == 0) {
          this_01 = (DomProperty *)operator_new(0x178);
          memset(this_01,0,0x178);
          DomProperty::read(this_01,__fd,__buf_01,(size_t)pcVar3);
          clear(this);
          this->m_kind = Texture;
          this->m_texture = this_01;
        }
        else {
          QVar8.m_data = L"gradient";
          QVar8.m_size = 8;
          pcVar3 = L"gradient";
          iVar2 = QtPrivate::compareStrings(QVar9,QVar8,CaseInsensitive);
          if (iVar2 == 0) {
            this_02 = (DomGradient *)operator_new(0x118);
            memset(this_02,0,0x118);
            DomGradient::DomGradient(this_02);
            DomGradient::read(this_02,__fd,__buf_02,(size_t)pcVar3);
            clear(this);
            this->m_kind = Gradient;
            this->m_gradient = this_02;
          }
          else {
            local_98.a.m_size = 0x13;
            local_98.a.m_data = "Unexpected element ";
            local_98.b = &local_68;
            QStringBuilder<QLatin1String,_const_QStringView_&>::convertTo<QString>
                      (&local_80,&local_98);
            QXmlStreamReader::raiseError((QString *)CONCAT44(in_register_00000034,__fd));
            if (&(local_80.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if (((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate(&(local_80.d.d)->super_QArrayData,2,0x10);
              }
            }
          }
        }
      }
    }
    else if (iVar2 == 5) break;
    iVar2 = QXmlStreamReader::error();
  }
  QArrayDataPointer<QXmlStreamAttribute>::~QArrayDataPointer(&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return *(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void DomBrush::read(QXmlStreamReader &reader)
{
    const QXmlStreamAttributes &attributes = reader.attributes();
    for (const QXmlStreamAttribute &attribute : attributes) {
        const auto name = attribute.name();
        if (name == u"brushstyle"_s) {
            setAttributeBrushStyle(attribute.value().toString());
            continue;
        }
        reader.raiseError("Unexpected attribute "_L1 + name);
    }

    while (!reader.hasError()) {
        switch (reader.readNext()) {
        case QXmlStreamReader::StartElement : {
            const auto tag = reader.name();
            if (!tag.compare(u"color"_s, Qt::CaseInsensitive)) {
                auto *v = new DomColor();
                v->read(reader);
                setElementColor(v);
                continue;
            }
            if (!tag.compare(u"texture"_s, Qt::CaseInsensitive)) {
                auto *v = new DomProperty();
                v->read(reader);
                setElementTexture(v);
                continue;
            }
            if (!tag.compare(u"gradient"_s, Qt::CaseInsensitive)) {
                auto *v = new DomGradient();
                v->read(reader);
                setElementGradient(v);
                continue;
            }
            reader.raiseError("Unexpected element "_L1 + tag);
        }
            break;
        case QXmlStreamReader::EndElement :
            return;
        default :
            break;
        }
    }
}